

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.cpp
# Opt level: O3

void __thiscall wasm::PassRunner::addIfNoDWARFIssues(PassRunner *this,string *passName)

{
  pointer pcVar1;
  char cVar2;
  bool bVar3;
  long *local_50 [2];
  long local_40 [2];
  long *local_30;
  long *local_28;
  
  pcVar1 = (passName->_M_dataplus)._M_p;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,pcVar1,pcVar1 + passName->_M_string_length);
  PassRegistry::createPass((PassRegistry *)&local_30,(string *)singleton);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  cVar2 = (**(code **)(*local_30 + 0x38))(local_30);
  if (((cVar2 == '\0') || (bVar3 = Debug::shouldPreserveDWARF(&this->options,this->wasm), !bVar3))
     || ((this->addedPassesRemovedDWARF & 1U) != 0)) {
    local_28 = local_30;
    (*this->_vptr_PassRunner[2])(this);
    local_30 = local_28;
    if (local_28 == (long *)0x0) {
      return;
    }
  }
  (**(code **)(*local_30 + 8))(local_30);
  return;
}

Assistant:

void PassRunner::addIfNoDWARFIssues(std::string passName) {
  auto pass = PassRegistry::get()->createPass(passName);
  if (!pass->invalidatesDWARF() || !shouldPreserveDWARF()) {
    doAdd(std::move(pass));
  }
}